

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AuxiliaryMemorySwitches.hpp
# Opt level: O3

void __thiscall
Apple::II::
AuxiliaryMemorySwitches<Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)0,_true>_>
::set_main_paging(AuxiliaryMemorySwitches<Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)0,_true>_>
                  *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  Region RVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  
  bVar1 = (this->main_state_).base.read;
  bVar2 = (this->main_state_).base.write;
  bVar3 = (this->main_state_).region_04_08.read;
  bVar4 = (this->main_state_).region_04_08.write;
  bVar5 = (this->main_state_).region_20_40.read;
  bVar6 = (this->main_state_).region_20_40.write;
  bVar7 = (this->switches_).read_auxiliary_memory;
  cVar13 = (this->switches_).write_auxiliary_memory;
  (this->main_state_).base.read = bVar7;
  (this->main_state_).base.write = (bool)cVar13;
  if ((this->switches_).store_80 == true) {
    cVar14 = (this->switches_).video_page_2;
    bVar8 = (this->switches_).high_resolution;
    (this->main_state_).region_04_08.write = (bool)cVar14;
    (this->main_state_).region_04_08.read = (bool)cVar14;
    cVar10 = cVar14;
    if (bVar8 == true) {
      (this->main_state_).region_20_40.write = (bool)cVar14;
      (this->main_state_).region_20_40.read = (bool)cVar14;
      cVar12 = cVar14;
      cVar11 = cVar14;
      goto LAB_0026cd72;
    }
    RVar9 = (this->main_state_).base;
    (this->main_state_).region_20_40 = RVar9;
    cVar13 = RVar9.write;
  }
  else {
    RVar9 = (this->main_state_).base;
    (this->main_state_).region_20_40 = RVar9;
    (this->main_state_).region_04_08 = RVar9;
    cVar10 = RVar9.write;
    cVar14 = RVar9.read;
    cVar13 = cVar10;
  }
  cVar12 = RVar9.read;
  cVar11 = cVar13;
LAB_0026cd72:
  if ((((bVar1 == bVar7) && (bVar2 == (bool)cVar13)) && (bVar3 == (bool)cVar14)) &&
     (((bVar4 == (bool)cVar10 && (bVar5 == (bool)cVar12)) && (bVar6 == (bool)cVar11)))) {
    return;
  }
  ConcreteMachine<(Analyser::Static::AppleII::Target::Model)0,_true>::set_paging<1>(this->machine_);
  return;
}

Assistant:

void set_main_paging() {
			const auto previous_state = main_state_;

			// The two appropriately named switches provide the base case.
			main_state_.base.read = switches_.read_auxiliary_memory;
			main_state_.base.write = switches_.write_auxiliary_memory;

			if(switches_.store_80) {
				// If store 80 is set, use the page 2 flag for the lower carve out;
				// if both store 80 and high resolution are set, use the page 2 flag for both carve outs.
				main_state_.region_04_08.read = main_state_.region_04_08.write = switches_.video_page_2;

				if(switches_.high_resolution) {
					main_state_.region_20_40.read = main_state_.region_20_40.write = switches_.video_page_2;
				} else {
					main_state_.region_20_40 = main_state_.base;
				}
			} else {
				main_state_.region_04_08 = main_state_.region_20_40 = main_state_.base;
			}

			if(previous_state != main_state_) {
				machine_.template set_paging<PagingType::Main>();
			}
		}